

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::CloseGap
          (RepeatedPtrFieldBase *this,int start,int num)

{
  Rep *pRVar1;
  int iVar2;
  long lVar3;
  
  if (this->rep_ != (Rep *)0x0) {
    pRVar1 = this->rep_;
    iVar2 = pRVar1->allocated_size;
    if (start + num < iVar2) {
      lVar3 = (long)(start + num);
      do {
        *(void **)((long)pRVar1 + (long)num * -8 + 8 + lVar3 * 8) = pRVar1->elements[lVar3];
        lVar3 = lVar3 + 1;
        pRVar1 = this->rep_;
        iVar2 = pRVar1->allocated_size;
      } while (lVar3 < iVar2);
    }
    this->current_size_ = this->current_size_ - num;
    pRVar1->allocated_size = iVar2 - num;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::CloseGap(int start, int num) {
  if (rep_ == NULL) return;
  // Close up a gap of "num" elements starting at offset "start".
  for (int i = start + num; i < rep_->allocated_size; ++i)
    rep_->elements[i - num] = rep_->elements[i];
  current_size_ -= num;
  rep_->allocated_size -= num;
}